

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qloggingregistry.cpp
# Opt level: O3

CategoryFilter __thiscall
QLoggingRegistry::installFilter(QLoggingRegistry *this,CategoryFilter filter)

{
  __pointer_type copy;
  CategoryFilter p_Var1;
  code *pcVar2;
  bool bVar3;
  
  if ((this->registryMutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p == (__pointer_type)0x0) {
    LOCK();
    bVar3 = (this->registryMutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p == (__pointer_type)0x0;
    if (bVar3) {
      (this->registryMutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p = (__pointer_type)0x1;
    }
    UNLOCK();
    if (bVar3) goto LAB_0024b562;
  }
  QBasicMutex::lockInternal((QBasicMutex *)this);
LAB_0024b562:
  pcVar2 = defaultCategoryFilter;
  if (filter != (CategoryFilter)0x0) {
    pcVar2 = filter;
  }
  p_Var1 = this->categoryFilter;
  this->categoryFilter = pcVar2;
  updateRules(this);
  LOCK();
  copy = (this->registryMutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p;
  (this->registryMutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p = (__pointer_type)0x0;
  UNLOCK();
  if (copy != (__pointer_type)0x1) {
    QBasicMutex::unlockInternalFutex((QBasicMutex *)this,copy);
  }
  return p_Var1;
}

Assistant:

QLoggingCategory::CategoryFilter
QLoggingRegistry::installFilter(QLoggingCategory::CategoryFilter filter)
{
    const auto locker = qt_scoped_lock(registryMutex);

    if (!filter)
        filter = defaultCategoryFilter;

    QLoggingCategory::CategoryFilter old = categoryFilter;
    categoryFilter = filter;

    updateRules();

    return old;
}